

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint16_t FACTCue_GetVariableIndex(FACTCue *pCue,char *szFriendlyName)

{
  int iVar1;
  FACTAudioEngine *pFVar2;
  uint16_t uVar3;
  ulong uVar4;
  long lVar5;
  
  if (pCue == (FACTCue *)0x0) {
    uVar3 = 0xffff;
  }
  else {
    FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
    pFVar2 = pCue->parentBank->parentEngine;
    uVar3 = 0xffff;
    if (pFVar2->variableCount != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        iVar1 = SDL_strcmp(szFriendlyName,pFVar2->variableNames[uVar4]);
        if ((iVar1 == 0) &&
           (pFVar2 = pCue->parentBank->parentEngine,
           ((&pFVar2->variables->accessibility)[lVar5] & 4) != 0)) {
          uVar3 = (uint16_t)uVar4;
          break;
        }
        uVar4 = uVar4 + 1;
        pFVar2 = pCue->parentBank->parentEngine;
        lVar5 = lVar5 + 0x10;
      } while (uVar4 < pFVar2->variableCount);
    }
    FAudio_PlatformUnlockMutex(pFVar2->apiLock);
  }
  return uVar3;
}

Assistant:

uint16_t FACTCue_GetVariableIndex(
	FACTCue *pCue,
	const char *szFriendlyName
) {
	uint16_t i;
	if (pCue == NULL)
	{
		return FACTVARIABLEINDEX_INVALID;
	}
	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
	for (i = 0; i < pCue->parentBank->parentEngine->variableCount; i += 1)
	{
		if (	FAudio_strcmp(szFriendlyName, pCue->parentBank->parentEngine->variableNames[i]) == 0 &&
			pCue->parentBank->parentEngine->variables[i].accessibility & 0x04	)
		{
			FAudio_PlatformUnlockMutex(
				pCue->parentBank->parentEngine->apiLock
			);
			return i;
		}
	}
	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return FACTVARIABLEINDEX_INVALID;
}